

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O3

bool __thiscall FileTest::fillFile(FileTest *this,File *f)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char local_128 [264];
  
  cVar5 = '\0';
  cVar6 = '\x01';
  cVar7 = '\x02';
  cVar8 = '\x03';
  cVar9 = '\x04';
  cVar10 = '\x05';
  cVar11 = '\x06';
  cVar12 = '\a';
  cVar13 = '\b';
  cVar14 = '\t';
  cVar15 = '\n';
  cVar16 = '\v';
  cVar17 = '\f';
  cVar18 = '\r';
  cVar19 = '\x0e';
  cVar20 = '\x0f';
  lVar2 = 0;
  do {
    local_128[lVar2] = cVar5;
    local_128[lVar2 + 1] = cVar6;
    local_128[lVar2 + 2] = cVar7;
    local_128[lVar2 + 3] = cVar8;
    local_128[lVar2 + 4] = cVar9;
    local_128[lVar2 + 5] = cVar10;
    local_128[lVar2 + 6] = cVar11;
    local_128[lVar2 + 7] = cVar12;
    local_128[lVar2 + 8] = cVar13;
    local_128[lVar2 + 9] = cVar14;
    local_128[lVar2 + 10] = cVar15;
    local_128[lVar2 + 0xb] = cVar16;
    local_128[lVar2 + 0xc] = cVar17;
    local_128[lVar2 + 0xd] = cVar18;
    local_128[lVar2 + 0xe] = cVar19;
    local_128[lVar2 + 0xf] = cVar20;
    lVar2 = lVar2 + 0x10;
    cVar5 = cVar5 + DAT_00106180;
    cVar6 = cVar6 + DAT_00106180._1_1_;
    cVar7 = cVar7 + DAT_00106180._2_1_;
    cVar8 = cVar8 + DAT_00106180._3_1_;
    cVar9 = cVar9 + DAT_00106180._4_1_;
    cVar10 = cVar10 + DAT_00106180._5_1_;
    cVar11 = cVar11 + DAT_00106180._6_1_;
    cVar12 = cVar12 + DAT_00106180._7_1_;
    cVar13 = cVar13 + DAT_00106180._8_1_;
    cVar14 = cVar14 + DAT_00106180._9_1_;
    cVar15 = cVar15 + DAT_00106180._10_1_;
    cVar16 = cVar16 + DAT_00106180._11_1_;
    cVar17 = cVar17 + DAT_00106180._12_1_;
    cVar18 = cVar18 + DAT_00106180._13_1_;
    cVar19 = cVar19 + DAT_00106180._14_1_;
    cVar20 = cVar20 + DAT_00106180._15_1_;
  } while (lVar2 != 0x100);
  local_128[0] = '\0';
  iVar1 = (**(code **)(*(long *)f + 0x18))(f,local_128,0x100);
  uVar4 = 0;
  if (iVar1 == 0x100) {
    do {
      uVar3 = uVar4;
      if (uVar3 == 5) break;
      local_128[0] = (char)(uVar3 + 1);
      iVar1 = (**(code **)(*(long *)f + 0x18))(f,local_128,0x100);
      uVar4 = uVar3 + 1;
    } while (iVar1 == 0x100);
    uVar4 = (uint)(4 < uVar3);
  }
  return SUB41(uVar4,0);
}

Assistant:

bool FileTest::fillFile( File &f )
{
	uint8_t buffer[ 256 ];
	
	for ( int i = 0; i < 256; i++ )
		buffer[ i ] = i;
	
	for ( int i = 0; i < 6; i++ )
	{
		buffer[ 0 ] = i;

		int res = f.write( buffer, 256 );
		
		if ( res != 256 )
			return false;
	}
	return true;
}